

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::expressionStatement(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<Expression> expr;
  undefined1 local_39;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  
  expression((Parser *)local_38);
  consume(in_RSI,StatEnd,"\';\'");
  local_28._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExpressionStatement,std::allocator<ExpressionStatement>,std::shared_ptr<Expression>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8),
             (ExpressionStatement **)local_28,(allocator<ExpressionStatement> *)&local_39,
             (shared_ptr<Expression> *)local_38);
  (this->filepath)._M_dataplus._M_p = (pointer)local_28._0_8_;
  (this->filepath)._M_string_length = local_28._8_8_;
  _Var1._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::expressionStatement() {
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<ExpressionStatement>(expr);
}